

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O1

uint32_t __thiscall Jinx::Impl::Parser::ParseSubscriptSet(Parser *this)

{
  pointer pSVar1;
  uint32_t uVar2;
  
  uVar2 = 0;
  if (((this->m_error == false) &&
      (uVar2 = 0,
      (this->m_currentSymbol)._M_current !=
      (this->m_symbolList->
      super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl.
      super__Vector_impl_data._M_finish)) && (this->m_error == false)) {
    uVar2 = 0;
    do {
      pSVar1 = (this->m_currentSymbol)._M_current;
      if (pSVar1 == (this->m_symbolList->
                    super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                    _M_impl.super__Vector_impl_data._M_finish) {
        return uVar2;
      }
      if (pSVar1->type != SquareOpen) {
        return uVar2;
      }
      this->m_lastLine = pSVar1->lineNumber;
      (this->m_currentSymbol)._M_current = pSVar1 + 1;
      ParseExpression(this,(this->m_symbolList->
                           super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                           )._M_impl.super__Vector_impl_data._M_finish);
      Expect(this,SquareClose,(char *)0x0);
      uVar2 = uVar2 + 1;
    } while (this->m_error != true);
  }
  return uVar2;
}

Assistant:

inline_t uint32_t Parser::ParseSubscriptSet()
	{
		if (m_error || m_currentSymbol == m_symbolList.end())
			return 0;
		uint32_t count = 0;
		while (Accept(SymbolType::SquareOpen))
		{
			ParseExpression();
			Expect(SymbolType::SquareClose);
			++count;
		}
		return count;
	}